

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void dc_predictor_rect(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
                      int shift1,int multiplier)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < bw) {
    uVar3 = (ulong)(uint)bw;
  }
  iVar1 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + (uint)above[uVar2];
  }
  uVar2 = 0;
  uVar3 = 0;
  if (0 < bh) {
    uVar3 = (ulong)(uint)bh;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + (uint)left[uVar2];
  }
  while (iVar4 = (int)uVar3, uVar3 = (ulong)(iVar4 - 1), iVar4 != 0) {
    memset(dst,(iVar1 + ((uint)(bh + bw) >> 1) >> ((byte)shift1 & 0x1f)) * multiplier >> 0x10 & 0xff
           ,(ulong)(uint)bw);
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void dc_predictor_rect(uint8_t *dst, ptrdiff_t stride, int bw,
                                     int bh, const uint8_t *above,
                                     const uint8_t *left, int shift1,
                                     int multiplier) {
  int sum = 0;

  for (int i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (int i = 0; i < bh; i++) {
    sum += left[i];
  }

  const int expected_dc = divide_using_multiply_shift(
      sum + ((bw + bh) >> 1), shift1, multiplier, DC_SHIFT2);
  assert(expected_dc < (1 << 8));

  for (int r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}